

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::MissMatchObjectTest::MissMatchObjectTest
          (MissMatchObjectTest *this,Context *context)

{
  pointer *pptVar1;
  testCase *__args;
  iterator __position;
  undefined8 uVar2;
  GLenum GVar3;
  long lVar4;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"missmatch_object",
             "Test verifies if INVALID_VALUE is generated when object & target provided to CopySubImageData do not match"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MissMatchObjectTest_020ce9a8;
  lVar4 = 0;
  this->m_dst_name = 0;
  this->m_src_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    __args = (testCase *)((long)&MissMatchObjectTest::test_cases[0].m_obj_target + lVar4);
    __position._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::CopyImage::MissMatchObjectTest::testCase,std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::MissMatchObjectTest::testCase_const&>
                ((vector<gl4cts::CopyImage::MissMatchObjectTest::testCase,std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>>
                  *)&this->m_test_cases,__position,__args);
    }
    else {
      GVar3 = __args->m_dst_target;
      uVar2 = *(undefined8 *)((long)&MissMatchObjectTest::test_cases[0].m_src_target + lVar4);
      (__position._M_current)->m_obj_target = __args->m_obj_target;
      (__position._M_current)->m_dst_target = GVar3;
      (__position._M_current)->m_src_target = (int)uVar2;
      (__position._M_current)->m_expected_result = (int)((ulong)uVar2 >> 0x20);
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x80);
  return;
}

Assistant:

MissMatchObjectTest::MissMatchObjectTest(deqp::Context& context)
	: TestCase(
		  context, "missmatch_object",
		  "Test verifies if INVALID_VALUE is generated when object & target provided to CopySubImageData do not match")
	, m_dst_name(0)
	, m_src_name(0)
	, m_test_case_index(0)
{
	static const testCase test_cases[] = { { GL_TEXTURE_2D, GL_TEXTURE_2D, GL_TEXTURE_2D, GL_NO_ERROR },
										   { GL_TEXTURE_2D, GL_RENDERBUFFER, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_TEXTURE_2D, GL_TEXTURE_2D, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_TEXTURE_2D, GL_RENDERBUFFER, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_TEXTURE_2D, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_RENDERBUFFER, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_TEXTURE_2D, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_RENDERBUFFER, GL_RENDERBUFFER, GL_NO_ERROR } };

	static const GLuint n_test_cases = sizeof(test_cases) / sizeof(testCase);

	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		const testCase& test_case = test_cases[i];

		m_test_cases.push_back(test_case);
	}
}